

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O3

void pair1_pipe_recv_cb(void *arg)

{
  nni_mtx *mtx;
  nni_aio *aio;
  undefined8 *puVar1;
  _Bool _Var2;
  nng_err nVar3;
  uint32_t uVar4;
  int iVar5;
  nni_msg *m;
  size_t sz;
  nni_aio *aio_00;
  nni_pipe *p;
  
  p = *arg;
  puVar1 = *(undefined8 **)((long)arg + 8);
  aio = (nni_aio *)((long)arg + 0x1d8);
  nVar3 = nni_aio_result(aio);
  if (nVar3 == NNG_OK) {
    m = nni_aio_get_msg(aio);
    uVar4 = nni_pipe_id(*arg);
    nni_msg_set_pipe(m,uVar4);
    sz = nni_msg_len(m);
    if (3 < sz) {
      uVar4 = nni_msg_trim_u32(m);
      if (uVar4 < 0x100) {
        iVar5 = nni_atomic_get((nni_atomic_int *)(puVar1 + 3));
        if (iVar5 < (int)uVar4) {
          nni_stat_inc((nni_stat_item *)(puVar1 + 0x46),1);
          nni_msg_free(m);
          nni_aio_set_msg(aio,(nni_msg *)0x0);
          nni_pipe_recv(p,aio);
          return;
        }
        nni_sock_bump_rx((nni_sock *)*puVar1,sz);
        nni_msg_header_append_u32(m,uVar4);
        mtx = (nni_mtx *)(puVar1 + 4);
        nni_mtx_lock(mtx);
        aio_00 = (nni_aio *)nni_list_first((nni_list *)(puVar1 + 0x1e));
        if (aio_00 != (nni_aio *)0x0) {
          nni_aio_list_remove(aio_00);
          nni_aio_set_msg(aio_00,m);
          nni_pipe_recv(p,aio);
          nni_mtx_unlock(mtx);
          nni_aio_finish_sync(aio_00,NNG_OK,sz);
          return;
        }
        _Var2 = nni_lmq_full((nni_lmq *)(puVar1 + 0x15));
        if (_Var2) {
          *(undefined1 *)(puVar1 + 0x25) = 1;
        }
        else {
          nni_lmq_put((nni_lmq *)(puVar1 + 0x15),m);
          nni_aio_set_msg(aio,(nni_msg *)0x0);
          nni_pipe_recv(p,aio);
        }
        nni_pollable_raise((nni_pollable *)(puVar1 + 0x23));
        nni_mtx_unlock(mtx);
        return;
      }
    }
    nni_stat_inc((nni_stat_item *)(puVar1 + 0x4e),1);
    nni_msg_free(m);
  }
  else {
    p = *arg;
  }
  nni_pipe_close(p);
  return;
}

Assistant:

static void
pair1_pipe_recv_cb(void *arg)
{
	pair1_pipe *p = arg;
	pair1_sock *s = p->pair;
	nni_msg    *msg;
	uint32_t    hdr;
	nni_pipe   *pipe = p->pipe;
	size_t      len;
	nni_aio    *a;

	if (nni_aio_result(&p->aio_recv) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	msg = nni_aio_get_msg(&p->aio_recv);

	// Store the pipe ID.
	nni_msg_set_pipe(msg, nni_pipe_id(p->pipe));
	len = nni_msg_len(msg);

	// If the message is missing the hop count header, scrap it.
	if ((len < sizeof(uint32_t)) ||
	    ((hdr = nni_msg_trim_u32(msg)) > 0xff)) {
		BUMP_STAT(&s->stat_rx_malformed);
		nni_msg_free(msg);
		nni_pipe_close(pipe);
		return;
	}

	// If we bounced too many times, discard the message, but
	// keep getting more.
	if ((int) hdr > nni_atomic_get(&s->ttl)) {
		BUMP_STAT(&s->stat_ttl_drop);
		nni_msg_free(msg);
		nni_aio_set_msg(&p->aio_recv, NULL);
		nni_pipe_recv(pipe, &p->aio_recv);
		return;
	}

	nni_sock_bump_rx(s->sock, len);

	// Store the hop count in the header.
	nni_msg_header_append_u32(msg, hdr);

	nni_mtx_lock(&s->mtx);

	// if anyone is blocking, then the lmq will be empty, and
	// we should deliver it there.
	if ((a = nni_list_first(&s->raq)) != NULL) {
		nni_aio_list_remove(a);
		nni_aio_set_msg(a, msg);
		nni_pipe_recv(pipe, &p->aio_recv);
		nni_mtx_unlock(&s->mtx);
		nni_aio_finish_sync(a, 0, len);
		return;
	}

	// maybe we have room in the rmq?
	if (!nni_lmq_full(&s->rmq)) {
		nni_lmq_put(&s->rmq, msg);
		nni_aio_set_msg(&p->aio_recv, NULL);
		nni_pipe_recv(pipe, &p->aio_recv);
	} else {
		s->rd_ready = true;
	}
	nni_pollable_raise(&s->readable);
	nni_mtx_unlock(&s->mtx);
}